

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O1

int __thiscall Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  _Head_base<0UL,_Buffer::Members_*,_false> in_RAX;
  pointer __p_00;
  uchar *puVar2;
  pointer __p;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> local_28;
  
  if ((EVP_PKEY_CTX *)this != dst) {
    __p_00 = (pointer)operator_new(0x38);
    uVar1 = *(ulong *)(*(long *)dst + 0x28);
    (__p_00->str)._M_dataplus._M_p = (pointer)&(__p_00->str).field_2;
    puVar2 = (uchar *)0x0;
    (__p_00->str)._M_string_length = 0;
    (__p_00->str).field_2._M_local_buf[0] = '\0';
    __p_00->own_memory = true;
    __p_00->size = uVar1;
    __p_00->buf = (uchar *)0x0;
    if (uVar1 != 0) {
      puVar2 = (uchar *)operator_new__(uVar1);
    }
    __p_00->buf = puVar2;
    local_28._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
    super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
         (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)
         (_Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
    std::__uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>::reset
              ((__uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> *)this,
               __p_00);
    std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::~unique_ptr
              ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)&local_28);
    in_RAX._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
         super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
         super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl;
    if ((in_RAX._M_head_impl)->size != 0) {
      in_RAX._M_head_impl =
           (Members *)
           memcpy((in_RAX._M_head_impl)->buf,*(void **)(*(long *)dst + 0x30),
                  (in_RAX._M_head_impl)->size);
    }
  }
  return (int)in_RAX._M_head_impl;
}

Assistant:

void
Buffer::copy(Buffer const& rhs)
{
    if (this != &rhs) {
        m = std::unique_ptr<Members>(new Members(rhs.m->size, nullptr, true));
        if (m->size) {
            memcpy(m->buf, rhs.m->buf, m->size);
        }
    }
}